

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garbage_collection.cpp
# Opt level: O0

void scm::mark(Environment *env)

{
  bool bVar1;
  Verbosity VVar2;
  Object *obj;
  double __x;
  string local_50;
  reference local_30;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scm::Object_*>
  *binding;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scm::Object_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scm::Object_*>_>_>
  *__range1;
  Environment *env_local;
  
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scm::Object_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scm::Object_*>_>_>
           ::begin(&env->bindings);
  binding = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scm::Object_*>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scm::Object_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scm::Object_*>_>_>
               ::end(&env->bindings);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&binding), bVar1) {
    local_30 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scm::Object_*>_>
               ::operator*(&__end1);
    VVar2 = loguru::current_verbosity_cutoff();
    bVar1 = false;
    if ((-1 < VVar2) && ((LOG_GARBAGE_COLLECTION & 1) != 0)) {
      std::__cxx11::string::c_str();
      toString_abi_cxx11_(&local_50,(scm *)local_30->second,obj);
      bVar1 = true;
      __x = (double)std::__cxx11::string::c_str();
      loguru::log(__x);
    }
    if (bVar1) {
      std::__cxx11::string::~string((string *)&local_50);
    }
    markSchemeObject(local_30->second);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scm::Object_*>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void mark(Environment& env)
{
  for (auto& binding : env.bindings) {
    DLOG_IF_F(INFO,
              LOG_GARBAGE_COLLECTION,
              "marking binding %s | %s",
              binding.first.c_str(),
              toString(binding.second).c_str());
    markSchemeObject(binding.second);
  }
}